

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O2

int ExUtilGetInts(char *v,int base,int max_output,int *output)

{
  uint in_EAX;
  uint32_t uVar1;
  char *pcVar2;
  long lVar3;
  ulong uStack_38;
  int error;
  
  uStack_38 = (ulong)in_EAX;
  for (lVar3 = 0; (v != (char *)0x0 && (lVar3 < max_output)); lVar3 = lVar3 + 1) {
    uVar1 = ExUtilGetUInt(v,base,&error);
    if (error != 0) {
      return -1;
    }
    output[lVar3] = uVar1;
    pcVar2 = strchr(v,0x2c);
    v = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      v = (char *)0x0;
    }
  }
  return (int)lVar3;
}

Assistant:

int ExUtilGetInts(const char* v, int base, int max_output, int output[]) {
  int n, error = 0;
  for (n = 0; v != NULL && n < max_output; ++n) {
    const int value = ExUtilGetInt(v, base, &error);
    if (error) return -1;
    output[n] = value;
    v = strchr(v, ',');
    if (v != NULL) ++v;   // skip over the trailing ','
  }
  return n;
}